

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O0

int cuddZddSymmSiftingConv(DdManager *table,int lower,int upper)

{
  int local_58;
  int local_54;
  int local_4c;
  int iteration;
  int classes;
  int symgroups;
  int symvars;
  int result;
  int x;
  int initialSize;
  int nvars;
  int *var;
  int local_20;
  int i;
  int upper_local;
  int lower_local;
  DdManager *table_local;
  
  result = table->keysZ;
  x = table->sizeZ;
  _initialSize = (void *)0x0;
  local_20 = upper;
  i = lower;
  _upper_local = table;
  zdd_entry = (int *)malloc((long)x << 2);
  if (zdd_entry == (int *)0x0) {
    _upper_local->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    _initialSize = malloc((long)x << 2);
    if (_initialSize == (void *)0x0) {
      _upper_local->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      for (var._4_4_ = 0; (int)var._4_4_ < x; var._4_4_ = var._4_4_ + 1) {
        symvars = _upper_local->permZ[(int)var._4_4_];
        zdd_entry[(int)var._4_4_] = _upper_local->subtableZ[symvars].keys;
        *(uint *)((long)_initialSize + (long)(int)var._4_4_ * 4) = var._4_4_;
      }
      qsort(_initialSize,(long)x,4,cuddZddUniqueCompare);
      for (var._4_4_ = i; (int)var._4_4_ <= local_20; var._4_4_ = var._4_4_ + 1) {
        _upper_local->subtableZ[(int)var._4_4_].next = var._4_4_;
      }
      if (_upper_local->sizeZ < _upper_local->siftMaxVar) {
        local_54 = _upper_local->sizeZ;
      }
      else {
        local_54 = _upper_local->siftMaxVar;
      }
      var._4_4_ = 0;
      while( true ) {
        if ((local_54 <= (int)var._4_4_) || (_upper_local->siftMaxSwap <= zddTotalNumberSwapping)) {
          do {
            if ((uint)result <= _upper_local->keysZ) {
              cuddZddSymmSummary(_upper_local,i,local_20,&classes,&iteration);
              if (_initialSize != (void *)0x0) {
                free(_initialSize);
                _initialSize = (void *)0x0;
              }
              if (zdd_entry != (int *)0x0) {
                free(zdd_entry);
                zdd_entry = (int *)0x0;
              }
              return classes + 1;
            }
            result = _upper_local->keysZ;
            local_4c = 0;
            for (symvars = i; symvars <= local_20; symvars = symvars + 1) {
              for (; (uint)symvars < _upper_local->subtableZ[symvars].next;
                  symvars = _upper_local->subtableZ[symvars].next) {
              }
              var._4_4_ = _upper_local->invpermZ[symvars];
              zdd_entry[(int)var._4_4_] = _upper_local->subtableZ[symvars].keys;
              *(uint *)((long)_initialSize + (long)local_4c * 4) = var._4_4_;
              local_4c = local_4c + 1;
            }
            qsort(_initialSize,(long)local_4c,4,cuddZddUniqueCompare);
            if (x < _upper_local->siftMaxVar) {
              local_58 = x;
            }
            else {
              local_58 = _upper_local->siftMaxVar;
            }
            var._4_4_ = 0;
            while (((int)var._4_4_ < local_58 &&
                   (zddTotalNumberSwapping < _upper_local->siftMaxSwap))) {
              symvars = _upper_local->permZ[*(int *)((long)_initialSize + (long)(int)var._4_4_ * 4)]
              ;
              if ((_upper_local->subtableZ[symvars].next <= (uint)symvars) &&
                 (symgroups = cuddZddSymmSiftingConvAux(_upper_local,symvars,i,local_20),
                 symgroups == 0)) {
                symgroups = 0;
                goto LAB_00ac0ae7;
              }
              var._4_4_ = var._4_4_ + 1;
            }
          } while( true );
        }
        symvars = _upper_local->permZ[*(int *)((long)_initialSize + (long)(int)var._4_4_ * 4)];
        if ((i <= symvars) &&
           (((symvars <= local_20 && (_upper_local->subtableZ[symvars].next == symvars)) &&
            (symgroups = cuddZddSymmSiftingAux(_upper_local,symvars,i,local_20), symgroups == 0))))
        break;
        var._4_4_ = var._4_4_ + 1;
      }
      symgroups = 0;
    }
  }
LAB_00ac0ae7:
  if ((zdd_entry != (int *)0x0) && (zdd_entry != (int *)0x0)) {
    free(zdd_entry);
    zdd_entry = (int *)0x0;
  }
  if ((_initialSize != (void *)0x0) && (_initialSize != (void *)0x0)) {
    free(_initialSize);
  }
  return 0;
}

Assistant:

int
cuddZddSymmSiftingConv(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         i;
    int         *var;
    int         nvars;
    int         initialSize;
    int         x;
    int         result;
    int         symvars;
    int         symgroups;
    int         classes;
    int         iteration;
#ifdef DD_STATS
    int         previousSize;
#endif

    initialSize = table->keysZ;

    nvars = table->sizeZ;

    /* Find order in which to sift variables. */
    var = NULL;
    zdd_entry = ABC_ALLOC(int, nvars);
    if (zdd_entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSymmSiftingConvOutOfMem;
    }
    var = ABC_ALLOC(int, nvars);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSymmSiftingConvOutOfMem;
    }

    for (i = 0; i < nvars; i++) {
        x = table->permZ[i];
        zdd_entry[i] = table->subtableZ[x].keys;
        var[i] = i;
    }

    qsort((void *)var, nvars, sizeof(int), (DD_QSFP)cuddZddUniqueCompare);

    /* Initialize the symmetry of each subtable to itself
    ** for first pass of converging symmetric sifting.
    */
    for (i = lower; i <= upper; i++)
        table->subtableZ[i].next = i;

    iteration = ddMin(table->siftMaxVar, table->sizeZ);
    for (i = 0; i < iteration; i++) {
        if (zddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->permZ[var[i]];
        if (x < lower || x > upper) continue;
        /* Only sift if not in symmetry group already. */
        if (table->subtableZ[x].next == (unsigned) x) {
#ifdef DD_STATS
            previousSize = table->keysZ;
#endif
            result = cuddZddSymmSiftingAux(table, x, lower, upper);
            if (!result)
                goto cuddZddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
            if (table->keysZ < (unsigned) previousSize) {
                (void) fprintf(table->out,"-");
            } else if (table->keysZ > (unsigned) previousSize) {
                (void) fprintf(table->out,"+");
#ifdef DD_VERBOSE
                (void) fprintf(table->out,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keysZ, var[i]);
#endif
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }
    }

    /* Sifting now until convergence. */
    while ((unsigned) initialSize > table->keysZ) {
        initialSize = table->keysZ;
#ifdef DD_STATS
        (void) fprintf(table->out,"\n");
#endif
        /* Here we consider only one representative for each symmetry class. */
        for (x = lower, classes = 0; x <= upper; x++, classes++) {
            while ((unsigned) x < table->subtableZ[x].next)
                x = table->subtableZ[x].next;
            /* Here x is the largest index in a group.
            ** Groups consists of adjacent variables.
            ** Hence, the next increment of x will move it to a new group.
            */
            i = table->invpermZ[x];
            zdd_entry[i] = table->subtableZ[x].keys;
            var[classes] = i;
        }

        qsort((void *)var,classes,sizeof(int),(DD_QSFP)cuddZddUniqueCompare);

        /* Now sift. */
        iteration = ddMin(table->siftMaxVar, nvars);
        for (i = 0; i < iteration; i++) {
            if (zddTotalNumberSwapping >= table->siftMaxSwap)
                break;
            x = table->permZ[var[i]];
            if ((unsigned) x >= table->subtableZ[x].next) {
#ifdef DD_STATS
                previousSize = table->keysZ;
#endif
                result = cuddZddSymmSiftingConvAux(table, x, lower, upper);
                if (!result)
                    goto cuddZddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
                if (table->keysZ < (unsigned) previousSize) {
                    (void) fprintf(table->out,"-");
                } else if (table->keysZ > (unsigned) previousSize) {
                    (void) fprintf(table->out,"+");
#ifdef DD_VERBOSE
                (void) fprintf(table->out,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keysZ, var[i]);
#endif
                } else {
                    (void) fprintf(table->out,"=");
                }
                fflush(table->out);
#endif
            }
        } /* for */
    }

    cuddZddSymmSummary(table, lower, upper, &symvars, &symgroups);

#ifdef DD_STATS
    (void) fprintf(table->out,"\n#:S_SIFTING %8d: symmetric variables\n",
                   symvars);
    (void) fprintf(table->out,"#:G_SIFTING %8d: symmetric groups\n",
                   symgroups);
#endif

    ABC_FREE(var);
    ABC_FREE(zdd_entry);

    return(1+symvars);

cuddZddSymmSiftingConvOutOfMem:

    if (zdd_entry != NULL)
        ABC_FREE(zdd_entry);
    if (var != NULL)
        ABC_FREE(var);

    return(0);

}